

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarySearch.cpp
# Opt level: O2

void ReadFile(string *fileName,vector<int,_std::allocator<int>_> *retVector)

{
  char cVar1;
  int iVar2;
  char inChar;
  uint local_22c;
  ifstream input;
  
  std::ifstream::ifstream(&input);
  std::ifstream::open((char *)&input,(_Ios_Openmode)(fileName->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      iVar2 = std::istream::peek();
      if (iVar2 == -1) break;
      std::istream::get((char *)&input);
      if ((int)inChar - 0x30U < 10) {
        local_22c = (int)inChar - 0x30U;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(retVector,(int *)&local_22c);
      }
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&input);
  return;
}

Assistant:

void ReadFile(std::string fileName, std::vector<int> *retVector)
{
    std::ifstream input;


    input.open(fileName.c_str());

    if(input.is_open())
    {
        while(input.peek() != EOF)
        {
            char inChar;
            input.get(inChar);

            if(isdigit(inChar))
            {
                retVector->push_back(inChar - 48);
            }
        }
    }

    input.close();
}